

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::
TestBody(ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
         *this)

{
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> a_00;
  Particle<(pica::Dimension)2> b;
  Particle<(pica::Dimension)2> b_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  ParticleRef pPVar4;
  undefined8 in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ParticleArray constParticles;
  ParticleType particle;
  int i;
  ParticleType particleArray [15];
  int numParticles;
  ParticleArray particles;
  ConstParticleRef in_stack_fffffffffffff908;
  undefined8 uVar5;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffff910;
  String *this_00;
  int *in_stack_fffffffffffff918;
  char *in_stack_fffffffffffff920;
  char *pcVar6;
  char *pcVar7;
  char *in_stack_fffffffffffff928;
  int iVar9;
  undefined8 uVar8;
  int iVar10;
  char *in_stack_fffffffffffff930;
  char *pcVar11;
  undefined8 in_stack_fffffffffffff938;
  Type TVar13;
  undefined8 uVar12;
  AssertHelper *in_stack_fffffffffffff940;
  AssertHelper *pAVar14;
  AssertHelper *pAVar15;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffff950;
  Message *in_stack_fffffffffffff968;
  Message *pMVar16;
  AssertHelper *in_stack_fffffffffffff970;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *pBVar17;
  AssertionResult *in_stack_fffffffffffff988;
  undefined1 *in_stack_fffffffffffff990;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  ConstParticleRef in_stack_fffffffffffff9a0;
  undefined1 *puVar18;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  char *in_stack_fffffffffffff9b8;
  char *in_stack_fffffffffffff9c0;
  undefined8 *puVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  undefined1 in_stack_fffffffffffff9e8 [32];
  double in_stack_fffffffffffffa08;
  AssertionResult local_578;
  String local_568 [2];
  double local_548;
  double dStack_540;
  double local_538;
  double dStack_530;
  Message *local_528;
  AssertHelper *pAStack_520;
  char *local_518;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *pBStack_510;
  undefined8 local_508;
  String *pSStack_500;
  undefined8 local_4f8;
  char *pcStack_4f0;
  undefined8 local_4e8;
  char *pcStack_4e0;
  undefined8 local_4d8;
  AssertHelper *pAStack_4d0;
  AssertionResult local_4c0;
  int local_4ac;
  int local_494;
  AssertionResult local_490;
  uint local_47c;
  int local_464;
  AssertionResult local_460 [2];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined2 uStack_410;
  undefined6 uStack_40e;
  undefined2 uStack_408;
  undefined8 uStack_406;
  int local_3f8;
  undefined8 local_3e8 [5];
  undefined1 auStack_3c0 [8];
  undefined1 auStack_3b8 [8];
  undefined8 auStack_3b0 [113];
  undefined8 uStack_28;
  
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x21846c);
  uStack_28._4_4_ = 0xf;
  puVar20 = &uStack_28;
  puVar21 = local_3e8;
  do {
    puVar19 = puVar21;
    pica::Particle<(pica::Dimension)2>::Particle(in_stack_fffffffffffff910);
    puVar21 = puVar19 + 8;
  } while (puVar21 != puVar20);
  for (local_3f8 = 0; TVar13 = (Type)((ulong)in_stack_fffffffffffff938 >> 0x20), local_3f8 < 0xf;
      local_3f8 = local_3f8 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (in_stack_fffffffffffff950);
    lVar2 = (long)local_3f8;
    lVar3 = lVar2 * 0x40;
    *(ulong *)(auStack_3c0 + lVar3 + 2) = CONCAT26(uStack_408,uStack_40e);
    *(undefined8 *)(auStack_3b8 + lVar3 + 2) = uStack_406;
    local_3e8[lVar2 * 8 + 4] = local_418;
    *(ulong *)(auStack_3c0 + lVar3) = CONCAT62(uStack_40e,uStack_410);
    local_3e8[lVar2 * 8 + 2] = local_428;
    local_3e8[lVar2 * 8 + 3] = uStack_420;
    local_3e8[lVar2 * 8] = local_438;
    local_3e8[lVar2 * 8 + 1] = uStack_430;
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::pushBack
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)in_stack_fffffffffffff910,
               in_stack_fffffffffffff908);
  }
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)in_stack_fffffffffffff910,
             (ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)in_stack_fffffffffffff908);
  local_464 = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::size
                        ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x2185b9);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (int *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    in_stack_fffffffffffff9c0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x21863a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar13,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0x21869d);
  }
  local_47c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x218724);
  if (local_47c == 0) {
    local_494 = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::size
                          ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x218742);
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               (int *)in_stack_fffffffffffff910);
    iVar9 = (int)((ulong)in_stack_fffffffffffff928 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_490);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff940);
      in_stack_fffffffffffff9b8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x2187bc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff940,TVar13,in_stack_fffffffffffff930,iVar9,
                 in_stack_fffffffffffff920);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
      testing::Message::~Message((Message *)0x21881f);
    }
    local_47c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2188a6);
    if (local_47c == 0) {
      for (local_4ac = 0; local_4ac < 0xf; local_4ac = local_4ac + 1) {
        lVar2 = (long)local_4ac;
        local_508 = local_3e8[lVar2 * 8];
        pSStack_500 = (String *)local_3e8[lVar2 * 8 + 1];
        local_4f8 = local_3e8[lVar2 * 8 + 2];
        pcStack_4f0 = (char *)local_3e8[lVar2 * 8 + 3];
        local_4e8 = local_3e8[lVar2 * 8 + 4];
        pcStack_4e0 = *(char **)(auStack_3c0 + lVar2 * 0x40);
        local_4d8 = *(undefined8 *)(auStack_3b8 + lVar2 * 0x40);
        pAStack_4d0 = (AssertHelper *)auStack_3b0[lVar2 * 8];
        pPVar4 = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::operator[]
                           ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)
                            in_stack_fffffffffffff910,
                            (int)((ulong)in_stack_fffffffffffff908 >> 0x20));
        local_548 = (pPVar4->position).x;
        dStack_540 = (pPVar4->position).y;
        local_538 = (pPVar4->p).x;
        dStack_530 = (pPVar4->p).y;
        pMVar16 = (Message *)(pPVar4->p).z;
        pAVar15 = (AssertHelper *)pPVar4->factor;
        pcVar7 = (char *)pPVar4->invGamma;
        pBVar17 = *(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> **)&pPVar4->typeIndex;
        a.position.y._0_7_ = in_stack_fffffffffffff998;
        a.position.x = (double)in_stack_fffffffffffff990;
        a.position.y._7_1_ = in_stack_fffffffffffff99f;
        a.p.x = (double)in_stack_fffffffffffff9a0;
        a.p.y = (double)&stack0xfffffffffffff908;
        a.p.z._0_7_ = in_stack_fffffffffffff9b0;
        a.p.z._7_1_ = in_stack_fffffffffffff9b7;
        a.factor = (FactorType)in_stack_fffffffffffff9b8;
        a.invGamma = (GammaType)in_stack_fffffffffffff9c0;
        a._56_8_ = puVar19;
        b.position.y = (double)puVar20;
        b.position.x = (double)in_RDI;
        b.p.x = (double)puVar21;
        b.p.y = (double)in_stack_fffffffffffff9e8._0_8_;
        b.p.z = (double)in_stack_fffffffffffff9e8._8_8_;
        b.factor = (FactorType)in_stack_fffffffffffff9e8._16_8_;
        b.invGamma = (GammaType)in_stack_fffffffffffff9e8._24_8_;
        b._56_8_ = in_stack_fffffffffffffa08;
        uVar5 = local_508;
        this_00 = pSStack_500;
        pcVar6 = pcStack_4f0;
        uVar8 = local_4e8;
        pcVar11 = pcStack_4e0;
        uVar12 = local_4d8;
        pAVar14 = pAStack_4d0;
        puVar18 = &stack0xfffffffffffff908;
        local_528 = pMVar16;
        pAStack_520 = pAVar15;
        local_518 = pcVar7;
        pBStack_510 = pBVar17;
        in_stack_fffffffffffff9b7 =
             BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
             eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
                       (pBVar17,a,b);
        iVar9 = (int)((ulong)uVar5 >> 0x20);
        TVar13 = (Type)((ulong)uVar12 >> 0x20);
        iVar10 = (int)((ulong)uVar8 >> 0x20);
        testing::AssertionResult::AssertionResult
                  ((AssertionResult *)this_00,SUB81((ulong)uVar5 >> 0x38,0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
        if (!bVar1) {
          testing::Message::Message((Message *)pAVar14);
          testing::internal::GetBoolAssertionFailureMessage
                    (in_stack_fffffffffffff988,(char *)pBVar17,pcVar7,(char *)pAVar15);
          testing::internal::String::c_str(local_568);
          testing::internal::AssertHelper::AssertHelper(pAVar14,TVar13,pcVar11,iVar10,pcVar6);
          testing::internal::AssertHelper::operator=(pAVar15,pMVar16);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::internal::String::~String(this_00);
          testing::Message::~Message((Message *)0x218ace);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x218b65);
        lVar2 = (long)local_4ac;
        in_stack_fffffffffffff908 = (ConstParticleRef)local_3e8[lVar2 * 8];
        in_stack_fffffffffffff910 = (Particle<(pica::Dimension)2> *)local_3e8[lVar2 * 8 + 1];
        pcVar7 = (char *)local_3e8[lVar2 * 8 + 3];
        iVar10 = (int)((ulong)local_3e8[lVar2 * 8 + 4] >> 0x20);
        pcVar6 = *(char **)(auStack_3c0 + lVar2 * 0x40);
        TVar13 = (Type)((ulong)*(undefined8 *)(auStack_3b8 + lVar2 * 0x40) >> 0x20);
        pAVar15 = (AssertHelper *)auStack_3b0[lVar2 * 8];
        in_stack_fffffffffffff9a0 =
             pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::operator[]
                       ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)this_00,iVar9);
        in_stack_fffffffffffffa08 = (in_stack_fffffffffffff9a0->position).x;
        pMVar16 = (Message *)(in_stack_fffffffffffff9a0->p).z;
        pAVar14 = (AssertHelper *)in_stack_fffffffffffff9a0->factor;
        pcVar11 = (char *)in_stack_fffffffffffff9a0->invGamma;
        pBVar17 = *(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> **)
                   &in_stack_fffffffffffff9a0->typeIndex;
        a_00.position.y._0_7_ = in_stack_fffffffffffff998;
        a_00.position.x = (double)&stack0xfffffffffffff908;
        a_00.position.y._7_1_ = in_stack_fffffffffffff99f;
        a_00.p.x = (double)in_stack_fffffffffffff9a0;
        a_00.p.y = (double)puVar18;
        a_00.p.z._0_7_ = in_stack_fffffffffffff9b0;
        a_00.p.z._7_1_ = in_stack_fffffffffffff9b7;
        a_00.factor = (FactorType)in_stack_fffffffffffff9b8;
        a_00.invGamma = (GammaType)in_stack_fffffffffffff9c0;
        a_00._56_8_ = puVar19;
        b_00.position.y = (double)puVar20;
        b_00.position.x = (double)in_RDI;
        b_00.p.x = (double)puVar21;
        b_00.p.y = (double)in_stack_fffffffffffff9e8._0_8_;
        b_00.p.z = (double)in_stack_fffffffffffff9e8._8_8_;
        b_00.factor = (FactorType)in_stack_fffffffffffff9e8._16_8_;
        b_00.invGamma = (GammaType)in_stack_fffffffffffff9e8._24_8_;
        b_00._56_8_ = in_stack_fffffffffffffa08;
        in_stack_fffffffffffff990 = &stack0xfffffffffffff908;
        in_stack_fffffffffffff99f =
             BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
             eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
                       (pBVar17,a_00,b_00);
        testing::AssertionResult::AssertionResult
                  ((AssertionResult *)in_stack_fffffffffffff910,
                   SUB81((ulong)in_stack_fffffffffffff908 >> 0x38,0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_578);
        if (!bVar1) {
          testing::Message::Message((Message *)pAVar15);
          testing::internal::GetBoolAssertionFailureMessage
                    (in_stack_fffffffffffff988,(char *)pBVar17,pcVar11,(char *)pAVar14);
          testing::internal::String::c_str((String *)&stack0xfffffffffffff9e8);
          testing::internal::AssertHelper::AssertHelper(pAVar15,TVar13,pcVar6,iVar10,pcVar7);
          testing::internal::AssertHelper::operator=(pAVar14,pMVar16);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
          testing::internal::String::~String((String *)in_stack_fffffffffffff910);
          testing::Message::~Message((Message *)0x218d75);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x218e09);
      }
      local_47c = 0;
    }
  }
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x218e46);
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x218e53);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, IndexAccess)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    const int numParticles = 15;
    ParticleType particleArray[numParticles];
    for (int i = 0; i < numParticles; i++) {
        ParticleType particle = this->randomParticle();
        particleArray[i] = particle;
        particles.pushBack(particle);
    }
    const ParticleArray constParticles = particles;
    ASSERT_EQ(numParticles, particles.size());
    ASSERT_EQ(numParticles, constParticles.size());
    for (int i = 0; i < numParticles; i++) {
        EXPECT_TRUE(this->eqParticles_(particleArray[i], particles[i]));
        EXPECT_TRUE(this->eqParticles_(particleArray[i], constParticles[i]));
    }
}